

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall
Sudoku::addDependenciesFields
          (Sudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *fields)

{
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *pvVar1;
  int iVar2;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  reference pvVar5;
  shared_ptr<Field> local_188;
  uint local_174;
  uint local_170;
  int dependency_y_2;
  int dependency_x_2;
  int j_1;
  int y_1;
  int x_1;
  int i_1;
  int block_no;
  char block [9] [9] [2];
  shared_ptr<Field> local_a8;
  shared_ptr<Field> local_98;
  uint local_88;
  uint local_84;
  int j;
  int i;
  shared_ptr<Field> local_70;
  uint local_5c;
  uint local_58;
  int dependency_y;
  int dependency_x;
  shared_ptr<Field> local_48;
  uint local_38;
  uint local_34;
  int dependency_y_1;
  int dependency_x_1;
  int block3x3_no_y;
  int block3x3_no_x;
  int field3x3_y;
  int field3x3_x;
  int y;
  int x;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *fields_local;
  Sudoku *this_local;
  
  if (this->size_ != 0) {
    _y = fields;
    fields_local = (vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *)this;
    for (field3x3_x = 0; field3x3_x < this->squared_size_; field3x3_x = field3x3_x + 1) {
      for (field3x3_y = 0; field3x3_y < this->squared_size_; field3x3_y = field3x3_y + 1) {
        for (block3x3_no_x = 0; block3x3_no_x < this->size_; block3x3_no_x = block3x3_no_x + 1) {
          for (block3x3_no_y = 0; pvVar1 = _y, block3x3_no_y < this->size_;
              block3x3_no_y = block3x3_no_y + 1) {
            dependency_x_1 = field3x3_x / this->size_;
            dependency_y_1 = field3x3_y / this->size_;
            if ((this->type_ != freeform) || (this->size_ != 3)) {
              local_34 = dependency_x_1 * this->size_ + block3x3_no_x;
              local_38 = dependency_y_1 * this->size_ + block3x3_no_y;
              if ((local_34 != field3x3_x) || (local_38 != field3x3_y)) {
                iVar2 = (*this->_vptr_Sudoku[7])
                                  (this,(ulong)(uint)field3x3_x,(ulong)(uint)field3x3_y);
                p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         std::
                         vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                         operator[](pvVar1,(long)iVar2);
                peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                         operator->(p_Var3);
                iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)local_34,(ulong)local_38);
                pvVar5 = std::
                         vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                         operator[](&this->fields_,(long)iVar2);
                std::shared_ptr<Field>::shared_ptr(&local_48,pvVar5);
                Field::addDependency(peVar4,&local_48);
                std::shared_ptr<Field>::~shared_ptr(&local_48);
              }
            }
            pvVar1 = _y;
            local_58 = block3x3_no_x * this->size_ + block3x3_no_y;
            local_5c = field3x3_y;
            if (local_58 != field3x3_x) {
              iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)field3x3_x,(ulong)(uint)field3x3_y)
              ;
              p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ::operator[](pvVar1,(long)iVar2);
              peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Var3);
              iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)local_58,(ulong)local_5c);
              pvVar5 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ::operator[](&this->fields_,(long)iVar2);
              std::shared_ptr<Field>::shared_ptr(&local_70,pvVar5);
              Field::addDependency(peVar4,&local_70);
              std::shared_ptr<Field>::~shared_ptr(&local_70);
            }
            pvVar1 = _y;
            local_58 = field3x3_x;
            local_5c = block3x3_no_x * this->size_ + block3x3_no_y;
            if (local_5c != field3x3_y) {
              iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)field3x3_x,(ulong)(uint)field3x3_y)
              ;
              p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ::operator[](pvVar1,(long)iVar2);
              peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Var3);
              iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)local_58,(ulong)local_5c);
              pvVar5 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ::operator[](&this->fields_,(long)iVar2);
              std::shared_ptr<Field>::shared_ptr((shared_ptr<Field> *)&j,pvVar5);
              Field::addDependency(peVar4,(shared_ptr<Field> *)&j);
              std::shared_ptr<Field>::~shared_ptr((shared_ptr<Field> *)&j);
            }
          }
        }
      }
    }
    if (this->type_ == diagonal) {
      for (local_84 = 0; (int)local_84 < this->squared_size_; local_84 = local_84 + 1) {
        for (local_88 = 0; pvVar1 = _y, (int)local_88 < this->squared_size_; local_88 = local_88 + 1
            ) {
          if (local_84 != local_88) {
            iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)local_84);
            p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                     operator[](pvVar1,(long)iVar2);
            peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var3);
            iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)local_88);
            pvVar5 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                     operator[](&this->fields_,(long)iVar2);
            std::shared_ptr<Field>::shared_ptr(&local_98,pvVar5);
            Field::addDependency(peVar4,&local_98);
            std::shared_ptr<Field>::~shared_ptr(&local_98);
          }
          pvVar1 = _y;
          if (local_84 != local_88) {
            iVar2 = (*this->_vptr_Sudoku[7])
                              (this,(ulong)local_84,(ulong)(~local_84 + this->squared_size_));
            p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                     operator[](pvVar1,(long)iVar2);
            peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(p_Var3);
            iVar2 = (*this->_vptr_Sudoku[7])
                              (this,(ulong)local_88,(ulong)(~local_88 + this->squared_size_));
            pvVar5 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                     operator[](&this->fields_,(long)iVar2);
            std::shared_ptr<Field>::shared_ptr(&local_a8,pvVar5);
            Field::addDependency(peVar4,&local_a8);
            std::shared_ptr<Field>::~shared_ptr(&local_a8);
          }
        }
      }
    }
    if ((this->type_ == freeform) && (this->size_ == 3)) {
      memcpy(&i_1,&DAT_0015e090,0xa2);
      for (x_1 = 0; x_1 < 9; x_1 = x_1 + 1) {
        for (y_1 = 0; y_1 < 9; y_1 = y_1 + 1) {
          j_1 = (int)*(char *)((long)&i_1 + (long)y_1 * 2 + (long)x_1 * 0x12);
          dependency_x_2 = (int)*(char *)((long)&i_1 + (long)y_1 * 2 + (long)x_1 * 0x12 + 1);
          for (dependency_y_2 = 0; pvVar1 = _y, dependency_y_2 < 9;
              dependency_y_2 = dependency_y_2 + 1) {
            local_170 = (uint)*(char *)((long)&i_1 + (long)dependency_y_2 * 2 + (long)x_1 * 0x12);
            local_174 = (uint)*(char *)((long)&i_1 + (long)dependency_y_2 * 2 + (long)x_1 * 0x12 + 1
                                       );
            if ((local_170 != j_1) || (local_174 != dependency_x_2)) {
              iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)(uint)j_1,(ulong)(uint)dependency_x_2);
              p_Var3 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ::operator[](pvVar1,(long)iVar2);
              peVar4 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Var3);
              iVar2 = (*this->_vptr_Sudoku[7])(this,(ulong)local_170,(ulong)local_174);
              pvVar5 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                       ::operator[](&this->fields_,(long)iVar2);
              std::shared_ptr<Field>::shared_ptr(&local_188,pvVar5);
              Field::addDependency(peVar4,&local_188);
              std::shared_ptr<Field>::~shared_ptr(&local_188);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Sudoku::addDependenciesFields(std::vector<std::shared_ptr<Field>> &fields)
{
  if(size_ == 0)
    return;

  //add dependencies
  // loop over all fields
  for(int x = 0; x < squared_size_; x++)    // x,y: global index of field for which dependencies are added
  {
    for (int y = 0; y < squared_size_; y++)
    {
      // loop over all fields in same block3x3
      for (int field3x3_x = 0; field3x3_x < size_; field3x3_x++)  // field3x3_x, field3x3_y: local index in own block3x3
      {
        for (int field3x3_y = 0; field3x3_y < size_; field3x3_y++)
        {

          int block3x3_no_x = int(x / size_);     // own index of block3x3
          int block3x3_no_y = int(y / size_);

          //add dependencies to all of 3x3 block
          if(type_ != SudokuType::freeform || size_ != 3)
          {
            int dependency_x = block3x3_no_x*size_ + field3x3_x;
            int dependency_y = block3x3_no_y*size_ + field3x3_y;

            if(dependency_x != x || dependency_y != y)
              fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
          }

          //add dependencies to all of row
          int dependency_x = field3x3_x*size_ + field3x3_y;   // this is actually an own loop over x=0..squared_size
          int dependency_y = y;

          if(dependency_x != x || dependency_y != y)
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);

          //add dependencies to all of column
          dependency_x = x;
          dependency_y = field3x3_x*size_ + field3x3_y; // this is actually an own loop over y=0..squared_size

          if(dependency_x != x || dependency_y != y)
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
        }
      }
    }
  }

  // add diagonal dependencies
  if(type_ == SudokuType::diagonal)
  {
    for(int i = 0; i < squared_size_; i++)
    {
      for(int j = 0; j < squared_size_; j++)
      {
        // diagonal lower left to upper right
        if(i != j)
          fields[index(i,i)]->addDependency(fields_[index(j,j)]);

        // diagonal upper left to lower right
        if(i != j)
          fields[index(i,squared_size_-1-i)]->addDependency(fields_[index(j,squared_size_-1-j)]);
      }
    }
  }

  // add block dependencies for freeform
  if(type_ == SudokuType::freeform && size_ == 3)
  {
    // center block
    char block[][9][2] = {
      {{3,3}, {4,3}, {5,3}, {3,4}, {4,4}, {5,4}, {3,5}, {4,5}, {5,5}},    // center block
      {{0,0}, {1,0}, {3,2}, {0,1}, {1,1}, {2,1}, {2,3}, {1,2}, {2,2}},    // lower left block
      {{3,0}, {4,0}, {5,0}, {3,1}, {4,1}, {5,1}, {2,0}, {4,2}, {6,0}},    // bottom block
      {{5,2}, {7,0}, {8,0}, {6,1}, {7,1}, {8,1}, {6,2}, {7,2}, {6,3}},    // lower right block
      {{8,2}, {7,3}, {8,3}, {6,4}, {7,4}, {8,4}, {8,6}, {7,5}, {8,5}},    // right block
      {{6,6}, {7,6}, {6,5}, {6,7}, {7,7}, {8,7}, {5,6}, {7,8}, {8,8}},    // upper right block
      {{2,8}, {4,6}, {6,8}, {3,7}, {4,7}, {5,7}, {3,8}, {4,8}, {5,8}},    // top block
      {{2,5}, {1,6}, {2,6}, {0,7}, {1,7}, {2,7}, {0,8}, {1,8}, {3,6}},    // upper left block
      {{0,3}, {1,3}, {0,2}, {0,4}, {1,4}, {2,4}, {0,5}, {1,5}, {0,6}}};   // left block

    for(int block_no = 0; block_no < 9; block_no++)
    {
      for(int i = 0; i < 9; i++)
      {
        int x = block[block_no][i][0];
        int y = block[block_no][i][1];

        for(int j = 0; j < 9; j++)
        {
          int dependency_x = block[block_no][j][0];
          int dependency_y = block[block_no][j][1];

          if(dependency_x != x || dependency_y != y)
          {
            fields[index(x,y)]->addDependency(fields_[index(dependency_x,dependency_y)]);
          }
        }
      }
    }
  }

}